

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O0

bool __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::PreprocessStaticConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                 *indc)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_> *in_RSI;
  double dVar4;
  NodeRange NVar5;
  int fixed_var_val;
  undefined8 in_stack_fffffffffffffdb8;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffdc0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_stack_fffffffffffffde8;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffdf0;
  bool local_1;
  
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
  get_binary_var(in_RSI);
  iVar2 = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::is_fixed(in_stack_fffffffffffffdc0,iVar2);
  if (bVar1) {
    IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
    get_binary_var(in_RSI);
    dVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::fixed_value(in_stack_fffffffffffffdc0,iVar2);
    iVar2 = (int)dVar4;
    iVar3 = IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
            get_binary_value(in_RSI);
    if (iVar2 == iVar3) {
      IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
      get_constraint(in_RSI);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
                ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)
                 CONCAT44(iVar2,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8);
      NVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
                        (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
                ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)NVar5.ir_);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PreprocessStaticConstraint(
      const IndicatorConstraint<SubCon>& indc) {
    if (MPCD( is_fixed(indc.get_binary_var()) )) {
      int fixed_var_val = MPCD( fixed_value(indc.get_binary_var()) );
      if (fixed_var_val == indc.get_binary_value()) {
        MPD( AddConstraint(indc.get_constraint()) );
      } else {
        // forget
      }
      return true;
    }
    return false;
  }